

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::SignCase::SignCase
          (SignCase *this,Context *context,DataType baseType,Precision precision,
          ShaderType shaderType)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string local_a0;
  VarType local_80;
  Symbol local_68;
  
  getCommonFuncCaseName_abi_cxx11_
            (&local_68.name,(Functional *)(ulong)baseType,precision,shaderType,shaderType);
  CommonFunctionCase::CommonFunctionCase
            (&this->super_CommonFunctionCase,context,local_68.name._M_dataplus._M_p,"sign",
             shaderType);
  paVar1 = &local_68.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.name._M_dataplus._M_p,local_68.name.field_2._M_allocated_capacity + 1);
  }
  (this->super_CommonFunctionCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__CommonFunctionCase_0219f8e0;
  paVar2 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"in0","");
  glu::VarType::VarType(&local_80,baseType,precision);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_68,&local_a0,&local_80);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>
            (&(this->super_CommonFunctionCase).m_spec.inputs,&local_68);
  glu::VarType::~VarType(&local_68.varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.name._M_dataplus._M_p,local_68.name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"out0","");
  glu::VarType::VarType(&local_80,baseType,precision);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_68,&local_a0,&local_80);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>
            (&(this->super_CommonFunctionCase).m_spec.outputs,&local_68);
  glu::VarType::~VarType(&local_68.varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.name._M_dataplus._M_p,local_68.name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_CommonFunctionCase).m_spec.source,0,
             (char *)(this->super_CommonFunctionCase).m_spec.source._M_string_length,0x1c56e6a);
  return;
}

Assistant:

SignCase (Context& context, glu::DataType baseType, glu::Precision precision, glu::ShaderType shaderType)
		: CommonFunctionCase(context, getCommonFuncCaseName(baseType, precision, shaderType).c_str(), "sign", shaderType)
	{
		m_spec.inputs.push_back(Symbol("in0", glu::VarType(baseType, precision)));
		m_spec.outputs.push_back(Symbol("out0", glu::VarType(baseType, precision)));
		m_spec.source = "out0 = sign(in0);";
	}